

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int source_set_address(SOURCE_HANDLE source,AMQP_VALUE address_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar2 = 0x3084;
  }
  else {
    iVar2 = 0x3094;
    if (address_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(address_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(source->composite_value,0,item_value);
        iVar2 = 0x309a;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int source_set_address(SOURCE_HANDLE source, AMQP_VALUE address_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE address_amqp_value;
        if (address_value == NULL)
        {
            address_amqp_value = NULL;
        }
        else
        {
            address_amqp_value = amqpvalue_clone(address_value);
        }
        if (address_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 0, address_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(address_amqp_value);
        }
    }

    return result;
}